

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

qint64 __thiscall
QJsonValueConstRef::concreteInt
          (QJsonValueConstRef *this,QJsonValueConstRef self,qint64 defaultValue,bool clamp)

{
  QSharedData *pQVar1;
  int iVar2;
  QCborContainerPrivate *pQVar3;
  enable_if_t<std::is_integral_v<long_long>,_bool> eVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double local_20;
  long local_18;
  
  dVar6 = self._8_8_;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (ulong)self.field_0.a >> (~self.field_0._0_1_ & 1);
  pQVar3 = (this->field_0).a[6].a.d.ptr;
  pQVar1 = &pQVar3->super_QSharedData + uVar7 * 4;
  iVar2 = (int)(&pQVar3->usedData)[uVar7 * 2];
  local_20 = dVar6;
  if (iVar2 == 0) {
    dVar5 = *(double *)pQVar1;
  }
  else {
    dVar5 = dVar6;
    if (iVar2 == 0x202) {
      eVar4 = anon_unknown.dwarf_a6f413::convertDoubleTo<long_long>
                        (*(double *)pQVar1,(longlong *)&local_20,true);
      if (eVar4) {
        dVar5 = local_20;
      }
    }
  }
  if ((double)(long)SUB84(dVar5,0) == dVar5) {
    dVar6 = dVar5;
  }
  if ((char)defaultValue == '\0') {
    dVar6 = dVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (qint64)dVar6;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QJsonValueConstRef::concreteInt(QJsonValueConstRef self, qint64 defaultValue, bool clamp) noexcept
{
    auto &e = QJsonPrivate::Value::elementHelper(self);
    qint64 v = defaultValue;
    if (e.type == QCborValue::Double) {
        // convertDoubleTo modifies the output even on returning false
        if (!convertDoubleTo<qint64>(e.fpvalue(), &v))
            v = defaultValue;
    } else if (e.type == QCborValue::Integer) {
        v = e.value;
    }
    if (clamp && qint64(int(v)) != v)
        return defaultValue;
    return v;
}